

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_7zip.c
# Opt level: O3

int compression_code_deflate(archive *a,la_zstream *lastrm,la_zaction action)

{
  z_streamp_conflict strm;
  uint uVar1;
  
  strm = (z_streamp_conflict)lastrm->real_stream;
  strm->next_in = lastrm->next_in;
  strm->avail_in = (uInt)lastrm->avail_in;
  strm->total_in = lastrm->total_in;
  strm->next_out = lastrm->next_out;
  strm->avail_out = (uInt)lastrm->avail_out;
  strm->total_out = lastrm->total_out;
  uVar1 = cm_zlib_deflate(strm,(uint)(action == ARCHIVE_Z_FINISH) << 2);
  lastrm->next_in = strm->next_in;
  lastrm->avail_in = (ulong)strm->avail_in;
  lastrm->total_in = strm->total_in;
  lastrm->next_out = strm->next_out;
  lastrm->avail_out = (ulong)strm->avail_out;
  lastrm->total_out = strm->total_out;
  if (1 < uVar1) {
    archive_set_error(a,-1,"GZip compression failed: deflate() call returned status %d",(ulong)uVar1
                     );
    uVar1 = 0xffffffe2;
  }
  return uVar1;
}

Assistant:

static int
compression_code_deflate(struct archive *a,
    struct la_zstream *lastrm, enum la_zaction action)
{
	z_stream *strm;
	int r;

	strm = (z_stream *)lastrm->real_stream;
	/* zlib.h is not const-correct, so we need this one bit
	 * of ugly hackery to convert a const * pointer to
	 * a non-const pointer. */
	strm->next_in = (Bytef *)(uintptr_t)(const void *)lastrm->next_in;
	strm->avail_in = (uInt)lastrm->avail_in;
	strm->total_in = (uLong)lastrm->total_in;
	strm->next_out = lastrm->next_out;
	strm->avail_out = (uInt)lastrm->avail_out;
	strm->total_out = (uLong)lastrm->total_out;
	r = deflate(strm,
	    (action == ARCHIVE_Z_FINISH)? Z_FINISH: Z_NO_FLUSH);
	lastrm->next_in = strm->next_in;
	lastrm->avail_in = strm->avail_in;
	lastrm->total_in = strm->total_in;
	lastrm->next_out = strm->next_out;
	lastrm->avail_out = strm->avail_out;
	lastrm->total_out = strm->total_out;
	switch (r) {
	case Z_OK:
		return (ARCHIVE_OK);
	case Z_STREAM_END:
		return (ARCHIVE_EOF);
	default:
		archive_set_error(a, ARCHIVE_ERRNO_MISC,
		    "GZip compression failed:"
		    " deflate() call returned status %d", r);
		return (ARCHIVE_FATAL);
	}
}